

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_wd_default(lyd_node_leaf_list *node)

{
  lys_node *plVar1;
  lys_iffeature *plVar2;
  lys_iffeature **pplVar3;
  lys_node *plVar4;
  byte bVar5;
  lyd_node_leaf_list *plVar6;
  byte bVar7;
  ulong uVar8;
  
  if (node == (lyd_node_leaf_list *)0x0) {
    return 0;
  }
  plVar1 = node->schema;
  if ((plVar1->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    return 0;
  }
  if ((node->field_0x9 & 1) == 0) {
    if (plVar1->nodetype == LYS_LEAF) {
      plVar4 = plVar1[1].prev;
      if (plVar4 == (lys_node *)0x0) {
        if ((plVar1->flags & 0x40) != 0) {
          return 0;
        }
        pplVar3 = &plVar1[1].iffeature;
        plVar4 = (lys_node *)0x0;
        while ((plVar2 = *pplVar3, plVar2 != (lys_iffeature *)0x0 && (plVar4 == (lys_node *)0x0))) {
          pplVar3 = (lys_iffeature **)&plVar2[2].features;
          plVar4 = (lys_node *)plVar2[3].ext;
        }
        if (plVar4 == (lys_node *)0x0) {
          return 0;
        }
      }
      if (plVar4 != (lys_node *)node->value_str) {
        return 0;
      }
    }
    else {
      if ((plVar1->module->field_0x40 & 0xc) == 0) {
        return 0;
      }
      bVar5 = plVar1->padding[2];
      if (bVar5 == 0) {
        if (*(int *)&plVar1[1].priv != 0) {
          return 0;
        }
        pplVar3 = &plVar1[1].iffeature;
        while( true ) {
          plVar2 = *pplVar3;
          if (plVar2 == (lys_iffeature *)0x0) {
            return 0;
          }
          if (plVar2[3].ext != (lys_ext_instance **)0x0) break;
          pplVar3 = (lys_iffeature **)&plVar2[2].features;
        }
        plVar4 = (lys_node *)&plVar2[3].ext;
        bVar5 = 1;
      }
      else {
        plVar4 = plVar1[1].prev;
      }
      if (node->parent == (lyd_node *)0x0) {
        do {
          plVar6 = node;
          node = (lyd_node_leaf_list *)plVar6->prev;
        } while (((lyd_node_leaf_list *)plVar6->prev)->next != (lyd_node *)0x0);
      }
      else {
        plVar6 = (lyd_node_leaf_list *)node->parent->child;
      }
      bVar7 = 0;
      for (; plVar6 != (lyd_node_leaf_list *)0x0; plVar6 = (lyd_node_leaf_list *)plVar6->next) {
        if (plVar6->schema == plVar1) {
          if (bVar7 == bVar5) {
            return 0;
          }
          if ((plVar1->flags & 0x100) == 0) {
            uVar8 = 0;
            while( true ) {
              if (bVar5 == uVar8) {
                return 0;
              }
              if (*(char **)(plVar4->padding + uVar8 * 8 + -0x1c) == plVar6->value_str) break;
              uVar8 = uVar8 + 1;
            }
            if (bVar5 == (byte)uVar8) {
              return 0;
            }
          }
          else if (*(char **)(plVar4->padding + (ulong)bVar7 * 8 + -0x1c) != plVar6->value_str) {
            return 0;
          }
          bVar7 = bVar7 + 1;
        }
      }
      if (bVar7 != bVar5) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

API int
lyd_wd_default(struct lyd_node_leaf_list *node)
{
    struct lys_node_leaf *leaf;
    struct lys_node_leaflist *llist;
    struct lyd_node *iter;
    struct lys_tpdf *tpdf;
    const char *dflt = NULL, **dflts = NULL;
    uint8_t dflts_size = 0, c, i;

    if (!node || !(node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        return 0;
    }

    if (node->dflt) {
        return 1;
    }

    if (node->schema->nodetype == LYS_LEAF) {
        leaf = (struct lys_node_leaf*)node->schema;

        /* get know if there is a default value */
        if (leaf->dflt) {
            /* leaf has a default value */
            dflt = leaf->dflt;
        } else if (!(leaf->flags & LYS_MAND_TRUE)) {
            /* get the default value from the type */
            for (tpdf = leaf->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
                dflt = tpdf->dflt;
            }
        }
        if (!dflt) {
            /* no default value */
            return 0;
        }

        /* compare the default value with the value of the leaf */
        if (!ly_strequal(dflt, node->value_str, 1)) {
            return 0;
        }
    } else if (node->schema->module->version >= 2) { /* LYS_LEAFLIST */
        llist = (struct lys_node_leaflist*)node->schema;

        /* get know if there is a default value */
        if (llist->dflt_size) {
            /* there are default values */
            dflts_size = llist->dflt_size;
            dflts = llist->dflt;
        } else if (!llist->min) {
            /* get the default value from the type */
            for (tpdf = llist->type.der; tpdf && !dflts; tpdf = tpdf->type.der) {
                if (tpdf->dflt) {
                    dflts = &tpdf->dflt;
                    dflts_size = 1;
                    break;
                }
            }
        }

        if (!dflts_size) {
            /* no default values to use */
            return 0;
        }

        /* compare the default value with the value of the leaf */
        /* first, find the first leaf-list's sibling */
        iter = (struct lyd_node *)node;
        if (iter->parent) {
            iter = iter->parent->child;
        } else {
            for (; iter->prev->next; iter = iter->prev);
        }
        for (c = 0; iter; iter = iter->next) {
            if (iter->schema != node->schema) {
                continue;
            }
            if (c == dflts_size) {
                /* to many leaf-list instances */
                return 0;
            }

            if (llist->flags & LYS_USERORDERED) {
                /* we have strict order */
                if (!ly_strequal(dflts[c], ((struct lyd_node_leaf_list *)iter)->value_str, 1)) {
                    return 0;
                }
            } else {
                /* node's value is supposed to match with one of the default values */
                for (i = 0; i < dflts_size; i++) {
                    if (ly_strequal(dflts[i], ((struct lyd_node_leaf_list *)iter)->value_str, 1)) {
                        break;
                    }
                }
                if (i == dflts_size) {
                    /* values do not match */
                    return 0;
                }
            }
            c++;
        }
        if (c != dflts_size) {
            /* different sets of leaf-list instances */
            return 0;
        }
    } else {
        return 0;
    }

    /* all checks ok */
    return 1;
}